

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O3

void __thiscall Refal2::CRuleParser::wordAfterDirection(CRuleParser *this)

{
  string *psVar1;
  int *piVar2;
  TVariableTypeTag type;
  TVariableTypeTag *pTVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  
  if ((this->super_CQualifierParser).token.type != TT_Word) {
    __assert_fail("token.type == TT_Word",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                  ,0x97,"void Refal2::CRuleParser::wordAfterDirection()");
  }
  if ((this->super_CQualifierParser).token.word._M_string_length != 0) {
    psVar1 = &(this->super_CQualifierParser).token.word;
    do {
      bVar5 = CompareNoCase(*(psVar1->_M_dataplus)._M_p,'k');
      if (bVar5) {
        CFunctionBuilder::AddLeftBracket((CFunctionBuilder *)this);
        iVar6 = 1;
      }
      else {
        pTVar3 = (this->super_CQualifierParser).token.word._M_dataplus._M_p;
        uVar4 = (this->super_CQualifierParser).token.word._M_string_length;
        type = *pTVar3;
        this->variableTypeTag = type;
        if (uVar4 < 2) {
          this->state = (TState)afterVariableType;
          *(undefined8 *)&this->field_0x1e80 = 0;
          return;
        }
        CFunctionBuilder::AddVariable((CFunctionBuilder *)this,type,pTVar3[1],(CQualifier *)0x0);
        iVar6 = 2;
      }
      piVar2 = &(this->super_CQualifierParser).token.position;
      *piVar2 = *piVar2 + iVar6;
      std::__cxx11::string::erase((ulong)psVar1,0);
    } while ((this->super_CQualifierParser).token.word._M_string_length != 0);
  }
  return;
}

Assistant:

void CRuleParser::wordAfterDirection()
{
	assert( token.type == TT_Word );
	while( !token.word.empty() ) {
		if( CompareNoCase( token.word[0], RuleLeftBracketTag ) ) {
			CFunctionBuilder::AddLeftBracket();
			token.position++;
			token.word.erase( 0, 1 );
		} else {
			variableTypeTag = token.word[0];
			if( token.word.length() > 1 ) {
				CFunctionBuilder::AddVariable( variableTypeTag, token.word[1] );
				token.position += 2;
				token.word.erase( 0, 2 );
			} else {
				state = &CRuleParser::afterVariableType;
				return;
			}
		}
	}
}